

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionWriter.hpp
# Opt level: O2

bool __thiscall binlog::SessionWriter::replaceChannel(SessionWriter *this,size_t minQueueCapacity)

{
  WriterProp *pWVar1;
  element_type *peVar2;
  Session *queueCapacity;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var3;
  char *pcVar4;
  WriterProp *writerProp;
  WriterProp wp;
  undefined1 auStack_98 [16];
  undefined1 local_88 [48];
  undefined1 local_58 [40];
  pointer local_30;
  
  pWVar1 = (WriterProp *)((this->_qw)._queue)->capacity;
  peVar2 = (this->_channel).super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_58._0_8_ = (peVar2->writerProp).id;
  std::__cxx11::string::string((string *)(local_58 + 8),(string *)&(peVar2->writerProp).name);
  writerProp = (WriterProp *)(minQueueCapacity * 2);
  if ((WriterProp *)(minQueueCapacity * 2) < pWVar1) {
    writerProp = pWVar1;
  }
  local_30 = (pointer)0x0;
  queueCapacity = this->_session;
  WriterProp::WriterProp((WriterProp *)local_88,(WriterProp *)local_58);
  Session::createChannel((Session *)auStack_98,(size_t)queueCapacity,writerProp);
  std::__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->_channel).
              super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2> *)auStack_98);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_98 + 8));
  std::__cxx11::string::~string((string *)(local_88 + 8));
  _Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl =
       (((this->_channel).super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
       super__Head_base<0UL,_char_*,_false>;
  pcVar4 = *(char **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
  (this->_qw)._queue =
       (Queue *)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
  (this->_qw)._writePos = pcVar4;
  (this->_qw)._writeEnd = pcVar4;
  std::__cxx11::string::~string((string *)(local_58 + 8));
  return true;
}

Assistant:

inline bool SessionWriter::replaceChannel(std::size_t minQueueCapacity) noexcept
{
  const std::size_t newCapacity = (std::max)(_qw.capacity(), 2 * minQueueCapacity);

  try
  {
    WriterProp wp{_channel->writerProp.id, _channel->writerProp.name, 0}; // avoid racing on the last field
    _channel = _session->createChannel(newCapacity, std::move(wp));
    _qw = detail::QueueWriter(_channel->queue());
  }
  catch (...)
  {
    // allocation and mutex lock in createChannel can throw,
    // but addEvent is more efficient if noexcept:
    // indicate failure by return value instead.
    return false;
  }

  return true;
}